

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O0

string * gmlc::networking::getLocalExternalAddressV4(string *server)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first2_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first1_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  flags fVar4;
  string *in_RDI;
  int mcnt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ndef;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int cnt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidate_addresses;
  endpoint ept;
  iterator it;
  query query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resolved_addresses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  string sstring;
  iterator end;
  endpoint servep;
  iterator it_server;
  error_code ec;
  query query_server;
  resolver resolver;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  string *def;
  basic_resolver_entry<asio::ip::tcp> *in_stack_fffffffffffffb18;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffb20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  flags in_stack_fffffffffffffb34;
  string *in_stack_fffffffffffffb38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last1;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  flags fVar5;
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *in_stack_fffffffffffffb48;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3f0;
  char *local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc28;
  flags local_3c4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390 [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e1 [2];
  int local_29c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f4;
  basic_resolver_query<asio::ip::tcp> local_1d8;
  error_code local_150;
  allocator<char> local_139 [37];
  int local_114;
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  AsioContextManager::getContextPointer(in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb20);
  CLI::std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x7d88f0);
  AsioContextManager::getBaseContext((AsioContextManager *)0x7d88f8);
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (io_context *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb34);
  local_114 = (int)::asio::ip::tcp::v4();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,
             (char *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
             (allocator<char> *)in_stack_fffffffffffffb50);
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (in_stack_fffffffffffffb50,(protocol_type *)in_stack_fffffffffffffb48,
             (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             in_stack_fffffffffffffb38,in_stack_fffffffffffffb34);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb20);
  std::allocator<char>::~allocator(local_139);
  CLI::std::error_code::error_code((error_code *)in_stack_fffffffffffffb20);
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            (in_stack_fffffffffffffb48,
             (query *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (error_code *)in_stack_fffffffffffffb38);
  ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb20,
             (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb18);
  ::asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)0x7d89ff);
  bVar1 = std::error_code::operator_cast_to_bool(&local_150);
  if (bVar1) {
    getLocalExternalAddressV4_abi_cxx11_();
    local_1d8.service_name_._M_dataplus._M_p._4_4_ = 1;
  }
  else {
    ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
              ((basic_resolver_iterator<asio::ip::tcp> *)0x7d8b21);
    ::asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint(in_stack_fffffffffffffb18);
    ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
              ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb20);
    uVar2 = ::asio::ip::operator==
                      ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb20,
                       (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb18);
    if ((bool)uVar2) {
      std::__cxx11::string::string
                (in_stack_fffffffffffffb60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
    }
    else {
      in_stack_fffffffffffffb68 = &local_1f4;
      ::asio::ip::basic_endpoint<asio::ip::tcp>::address(&in_stack_fffffffffffffb18->endpoint_);
      ::asio::ip::address::to_string_abi_cxx11_((address *)in_stack_fffffffffffffb28._M_current);
    }
    netif::getInterfaceAddressesV4_abi_cxx11_();
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x7d8bd5);
    local_29c = (int)::asio::ip::tcp::v4();
    ::asio::ip::host_name_abi_cxx11_();
    this = local_2e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
               (allocator<char> *)in_stack_fffffffffffffb50);
    ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
              (in_stack_fffffffffffffb50,(protocol_type *)in_stack_fffffffffffffb48,
               (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb38,in_stack_fffffffffffffb34);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb20);
    std::allocator<char>::~allocator((allocator<char> *)local_2e1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb20);
    ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
              (in_stack_fffffffffffffb48,
               (query *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (error_code *)in_stack_fffffffffffffb38);
    ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
              ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb20,
               (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb18);
    ::asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
              ((basic_resolver_results<asio::ip::tcp> *)0x7d8cbc);
    bVar1 = std::error_code::operator_cast_to_bool(&local_150);
    if (bVar1) {
      getLocalExternalAddressV4_abi_cxx11_();
      local_1d8.service_name_._M_dataplus._M_p._4_4_ = 1;
    }
    else {
      while (uVar3 = ::asio::ip::operator!=
                               ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb20,
                                (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb18)
            , (bool)uVar3) {
        ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
                  ((basic_resolver_iterator<asio::ip::tcp> *)0x7d8e21);
        ::asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint(in_stack_fffffffffffffb18)
        ;
        ::asio::ip::basic_endpoint<asio::ip::tcp>::address(&in_stack_fffffffffffffb18->endpoint_);
        ::asio::ip::address::to_string_abi_cxx11_((address *)in_stack_fffffffffffffb28._M_current);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb20);
        ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator++
                  ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb20);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(uVar2,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(uVar2,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68);
      prioritizeExternalAddresses(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_390,0);
      std::__cxx11::string::string
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(uVar3,in_stack_fffffffffffffb58));
      last1._M_current = (char *)&local_1d8;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb18);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb28._M_current);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb18);
      local_3e8 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                    (in_stack_fffffffffffffb28._M_current);
      first1._M_current._4_4_ = in_stack_fffffffffffffb44;
      first1._M_current._0_4_ = in_stack_fffffffffffffb40;
      first2._M_current._4_4_ = in_stack_fffffffffffffb34;
      first2._M_current._0_4_ = in_stack_fffffffffffffb30;
      local_3c4 = matchcount<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            (first1,last1,first2,in_stack_fffffffffffffb28);
      local_3f0 = local_390;
      fVar5 = local_3c4;
      local_3f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb18);
      local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb18);
      while (bVar1 = __gnu_cxx::
                     operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffb20,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffb18), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_3f8);
        std::__cxx11::string::string
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(uVar3,in_stack_fffffffffffffb58));
        in_stack_fffffffffffffb20 = &local_1d8;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb18);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb28._M_current);
        in_stack_fffffffffffffb28._M_current = (char *)&local_420;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb18);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb28._M_current);
        first1_00._M_current._4_4_ = fVar5;
        first1_00._M_current._0_4_ = in_stack_fffffffffffffb40;
        first2_00._M_current._4_4_ = in_stack_fffffffffffffb34;
        first2_00._M_current._0_4_ = in_stack_fffffffffffffb30;
        fVar4 = matchcount<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (first1_00,last1,first2_00,in_stack_fffffffffffffb28);
        in_stack_fffffffffffffb34 = fVar4;
        if (((int)local_3c4 < (int)fVar4) && (6 < (int)fVar4)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffb20,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffb18);
          local_3c4 = fVar4;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb20);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_3f8);
      }
      local_1d8.service_name_._M_dataplus._M_p._4_4_ = 1;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    }
    ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
              ((basic_resolver_iterator<asio::ip::tcp> *)0x7d9260);
    ::asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query
              (in_stack_fffffffffffffb20);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb20);
    ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
              ((basic_resolver_iterator<asio::ip::tcp> *)0x7d92a1);
  }
  ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x7d9300);
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(in_stack_fffffffffffffb20);
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::~basic_resolver
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffb20);
  CLI::std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x7d9327);
  return in_RDI;
}

Assistant:

std::string getLocalExternalAddressV4(const std::string& server)
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());

    asio::ip::tcp::resolver::query query_server(
        asio::ip::tcp::v4(), server, "");
    std::error_code ec;
    asio::ip::tcp::resolver::iterator it_server =
        resolver.resolve(query_server, ec);
    if (ec) {
        return getLocalExternalAddressV4();
    }
    asio::ip::tcp::endpoint servep = *it_server;

    asio::ip::tcp::resolver::iterator end;

    auto sstring = (it_server == end) ? server : servep.address().to_string();
#else
    std::string sstring = server;
#endif

    auto interface_addresses = gmlc::netif::getInterfaceAddressesV4();

    std::vector<std::string> resolved_addresses;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v4(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);
    if (ec) {
        return getLocalExternalAddressV4();
    }
    // asio::ip::tcp::endpoint endpoint = *it;

    while (it != end) {
        asio::ip::tcp::endpoint ept = *it;
        resolved_addresses.push_back(ept.address().to_string());
        ++it;
    }
#endif
    auto candidate_addresses =
        prioritizeExternalAddresses(interface_addresses, resolved_addresses);

    int cnt = 0;
    std::string def = candidate_addresses[0];
    cnt = matchcount(sstring.begin(), sstring.end(), def.begin(), def.end());
    for (auto ndef : candidate_addresses) {
        auto mcnt = matchcount(
            sstring.begin(), sstring.end(), ndef.begin(), ndef.end());
        if ((mcnt > cnt) && (mcnt >= 7)) {
            def = ndef;
            cnt = mcnt;
        }
    }
    return def;
}